

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusmenutypes.cpp
# Opt level: O1

QDBusArgument * operator<<(QDBusArgument *arg,QDBusMenuLayoutItem *item)

{
  __atomic_base<int> _Var1;
  QDBusArgument *arg_00;
  long lVar2;
  QDBusMenuLayoutItem *child;
  QDBusMenuLayoutItem *pQVar3;
  long in_FS_OFFSET;
  anon_union_24_3_e3d07ef4_for_data local_78;
  undefined8 uStack_60;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QDBusArgument::beginStructure();
  arg_00 = (QDBusArgument *)QDBusArgument::operator<<(arg,item->m_id);
  operator<<(arg_00,&item->m_properties);
  _Var1._M_i = (__int_type)QtPrivate::QMetaTypeInterfaceWrapper<QDBusVariant>::metaType.typeId;
  if ((__atomic_base<int>)
      QtPrivate::QMetaTypeInterfaceWrapper<QDBusVariant>::metaType.typeId._q_value.
      super___atomic_base<int>._M_i == (__atomic_base<int>)0x0) {
    _Var1._M_i = QMetaType::registerHelper
                           (&QtPrivate::QMetaTypeInterfaceWrapper<QDBusVariant>::metaType);
  }
  QMetaType::QMetaType((QMetaType *)&local_58.shared,_Var1._M_i);
  QDBusArgument::beginArray((QMetaType)arg);
  lVar2 = (item->m_children).d.size;
  if (lVar2 != 0) {
    pQVar3 = (item->m_children).d.ptr;
    lVar2 = lVar2 * 0x28;
    do {
      QVariant::QVariant((QVariant *)&local_78,(QMetaType)0x80a1c8,pQVar3);
      local_58._16_8_ = local_78._16_8_;
      uStack_40 = uStack_60;
      local_58.shared = local_78.shared;
      local_58._8_8_ = local_78._8_8_;
      local_78.shared = (PrivateShared *)0x0;
      local_78._8_8_ = 0;
      local_78._16_8_ = 0;
      uStack_60 = 2;
      QDBusArgument::operator<<(arg,(QDBusVariant *)&local_58);
      QVariant::~QVariant((QVariant *)&local_58);
      QVariant::~QVariant((QVariant *)&local_78);
      pQVar3 = pQVar3 + 1;
      lVar2 = lVar2 + -0x28;
    } while (lVar2 != 0);
  }
  QDBusArgument::endArray();
  QDBusArgument::endStructure();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return arg;
  }
  __stack_chk_fail();
}

Assistant:

const QDBusArgument &operator<<(QDBusArgument &arg, const QDBusMenuLayoutItem &item)
{
    arg.beginStructure();
    arg << item.m_id << item.m_properties;
    arg.beginArray(qMetaTypeId<QDBusVariant>());
    for (const QDBusMenuLayoutItem &child : item.m_children)
        arg << QDBusVariant(QVariant::fromValue<QDBusMenuLayoutItem>(child));
    arg.endArray();
    arg.endStructure();
    return arg;
}